

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     AssignmentOperatorHelper<false,_unsigned_char,_unsigned_char,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute(View<unsigned_char,_false,_std::allocator<unsigned_long>_> *from,
              View<unsigned_char,_false,_std::allocator<unsigned_long>_> *to)

{
  uchar uVar1;
  CoordinateOrder CVar2;
  size_t sVar3;
  size_t sVar4;
  reference puVar5;
  reference puVar6;
  reference puVar7;
  reference puVar8;
  size_t j;
  ulong dimension;
  bool bVar9;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  ToIterator itTo;
  undefined1 local_a0 [72];
  iterator local_58;
  
  if (from != to) {
    if (to->data_ == (pointer)0x0) {
      to->data_ = from->data_;
      Geometry<std::allocator<unsigned_long>_>::operator=(&to->geometry_,&from->geometry_);
      return;
    }
    if (from->data_ == (pointer)0x0) {
      bVar9 = false;
    }
    else {
      sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
      sVar4 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(to);
      bVar9 = sVar3 == sVar4;
    }
    Assert<bool>(bVar9);
    for (dimension = 0;
        sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from),
        dimension < sVar3; dimension = dimension + 1) {
      sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(from,dimension);
      sVar4 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(to,dimension);
      Assert<bool>(sVar3 == sVar4);
    }
    bVar9 = View<unsigned_char,false,std::allocator<unsigned_long>>::
            overlaps<unsigned_char,false,std::allocator<unsigned_long>>
                      ((View<unsigned_char,false,std::allocator<unsigned_long>> *)from,to);
    if (bVar9) {
      Marray<unsigned_char,std::allocator<unsigned_long>>::
      Marray<unsigned_char,false,std::allocator<unsigned_long>>
                ((Marray<unsigned_char,std::allocator<unsigned_long>> *)local_a0,from);
      execute((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_a0,to);
      Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
                ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_a0);
    }
    else {
      View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(from);
      CVar2 = (from->geometry_).coordinateOrder_;
      View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
      if (((CVar2 == (to->geometry_).coordinateOrder_) &&
          (bVar9 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::isSimple(from), bVar9
          )) && (bVar9 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::isSimple(to),
                bVar9)) {
        memcpy(to->data_,from->data_,(from->geometry_).size_);
        return;
      }
      sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
      if (sVar3 == 1) {
        View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                  ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a0,from);
        puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                           ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0);
        puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                           ((View<unsigned_char,false,std::allocator<unsigned_long>> *)from,0);
        OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(to,local_a0,puVar5,puVar6);
      }
      else {
        sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
        if (sVar3 == 2) {
          View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                    ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a0,from);
          puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                             ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0);
          puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                             ((View<unsigned_char,false,std::allocator<unsigned_long>> *)from,0);
          OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
          ::operate(to,local_a0,puVar5,puVar6);
        }
        else {
          sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
          if (sVar3 == 3) {
            View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                      ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a0,from);
            puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                               ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0);
            puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                               ((View<unsigned_char,false,std::allocator<unsigned_long>> *)from,0);
            OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(to,local_a0,puVar5,puVar6);
          }
          else {
            sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
            if (sVar3 == 4) {
              View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                        ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a0,from)
              ;
              puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                 ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0);
              puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                 ((View<unsigned_char,false,std::allocator<unsigned_long>> *)from,0)
              ;
              OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,local_a0,puVar5,puVar6);
            }
            else {
              sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar3 == 5) {
                View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                          ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a0,
                           from);
                puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                   ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0)
                ;
                puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                   ((View<unsigned_char,false,std::allocator<unsigned_long>> *)from,
                                    0);
                OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a0,puVar5,puVar6);
              }
              else {
                sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
                if (sVar3 == 6) {
                  View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                            ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a0,
                             from);
                  puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,
                                      0);
                  puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)
                                      from,0);
                  OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(to,local_a0,puVar5,puVar6);
                }
                else {
                  sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                                    (from);
                  if (sVar3 == 7) {
                    View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                              ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a0
                               ,from);
                    puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                       ((View<unsigned_char,false,std::allocator<unsigned_long>> *)
                                        to,0);
                    puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                       ((View<unsigned_char,false,std::allocator<unsigned_long>> *)
                                        from,0);
                    OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(to,local_a0,puVar5,puVar6);
                  }
                  else {
                    sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                                      (from);
                    if (sVar3 == 8) {
                      View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                                ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)
                                 local_a0,from);
                      puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                         ((View<unsigned_char,false,std::allocator<unsigned_long>> *
                                          )to,0);
                      puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                         ((View<unsigned_char,false,std::allocator<unsigned_long>> *
                                          )from,0);
                      OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(to,local_a0,puVar5,puVar6);
                    }
                    else {
                      sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                                        (from);
                      if (sVar3 == 9) {
                        View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                                  ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)
                                   local_a0,from);
                        puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                           ((View<unsigned_char,false,std::allocator<unsigned_long>>
                                             *)to,0);
                        puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                           ((View<unsigned_char,false,std::allocator<unsigned_long>>
                                             *)from,0);
                        OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(to,local_a0,puVar5,puVar6);
                      }
                      else {
                        sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::
                                dimension(from);
                        if (sVar3 != 10) {
                          View<unsigned_char,_false,_std::allocator<unsigned_long>_>::begin
                                    ((const_iterator *)local_a0,from);
                          View<unsigned_char,_false,_std::allocator<unsigned_long>_>::begin
                                    (&local_58,to);
                          while (bVar9 = Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                         ::hasMore((
                                                  Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                                  *)local_a0), bVar9) {
                            puVar7 = Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::
                                     operator*((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                                *)local_a0);
                            uVar1 = *puVar7;
                            puVar8 = Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>
                                     ::operator*(&local_58);
                            *puVar8 = uVar1;
                            Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::
                            operator++((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                        *)local_a0);
                            Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>::
                            operator++(&local_58);
                          }
                          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                          ~_Vector_base(&local_58.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       );
                          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                          ~_Vector_base((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         *)(local_a0 + 0x18));
                          return;
                        }
                        View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                                  ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)
                                   local_a0,from);
                        puVar5 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                           ((View<unsigned_char,false,std::allocator<unsigned_long>>
                                             *)to,0);
                        puVar6 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                           ((View<unsigned_char,false,std::allocator<unsigned_long>>
                                             *)from,0);
                        OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(to,local_a0,puVar5,puVar6);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      Geometry<std::allocator<unsigned_long>_>::~Geometry
                ((Geometry<std::allocator<unsigned_long>_> *)(local_a0 + 8));
    }
  }
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, false, AFrom>& from,
        View<TTo, false, ATo>& to
    )
    {
        typedef typename View<TFrom, false, AFrom>::const_iterator FromIterator;
        typedef typename View<TTo, false, ATo>::iterator ToIterator;
        if(static_cast<const void*>(&from) != static_cast<const void*>(&to)) { // no self-assignment
            if(to.data_ == 0) { // if the view 'to' is not initialized
                // initialize the view 'to' with source data
                Assert(MARRAY_NO_ARG_TEST || sizeof(TTo) == sizeof(TFrom));
                to.data_ = static_cast<TTo*>(static_cast<void*>(from.data_)); // copy pointer
                to.geometry_ = from.geometry_;
            }
            else { // if the view 'to' is initialized
                if(!MARRAY_NO_ARG_TEST) {
                    Assert(from.data_ != 0 && from.dimension() == to.dimension());
                    for(std::size_t j=0; j<from.dimension(); ++j) {
                        Assert(from.shape(j) == to.shape(j));
                    }
                }
                if(from.overlaps(to)) {
                    Marray<TFrom, AFrom> m = from; // temporary copy
                    execute(m, to);
                }
                else if(from.coordinateOrder() == to.coordinateOrder() 
                        && from.isSimple() && to.isSimple()
                        && IsEqual<TFrom, TTo>::type) {
                    memcpy(to.data_, from.data_, (from.size())*sizeof(TFrom));
                }
                else if(from.dimension() == 1)
                    OperateHelperBinary<1, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 2)
                    OperateHelperBinary<2, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 3)
                    OperateHelperBinary<3, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 4)
                    OperateHelperBinary<4, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 5)
                    OperateHelperBinary<5, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 6)
                    OperateHelperBinary<6, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 7)
                    OperateHelperBinary<7, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 8)
                    OperateHelperBinary<8, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 9)
                    OperateHelperBinary<9, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 10)
                    OperateHelperBinary<10, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else {
                    FromIterator itFrom = from.begin();
                    ToIterator itTo = to.begin();
                    for(; itFrom.hasMore(); ++itFrom, ++itTo) {
                        *itTo = static_cast<TTo>(*itFrom);
                    }
                }
            }
        }
    }